

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::segmentcheckReverse(string *unit,char closeSegment,int *index)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  int *in_RDX;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffdc;
  char mchar;
  undefined7 in_stack_ffffffffffffffe8;
  
  iVar4 = *in_RDX;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (iVar4 < (int)sVar2) {
LAB_007a52a1:
    do {
      while( true ) {
        if (*in_RDX < 0) {
          return false;
        }
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (size_type)in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffdc = CONCAT13(*pvVar3,(int3)in_stack_ffffffffffffffdc);
        *in_RDX = *in_RDX + -1;
        if ((*in_RDX < 0) ||
           (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  (size_type)in_stack_ffffffffffffffc8), *pvVar3 != '\\')) break;
        *in_RDX = *in_RDX + -1;
      }
      mchar = (char)((uint)in_stack_ffffffffffffffdc >> 0x18);
      if (mchar == in_SIL) {
        return true;
      }
      in_stack_ffffffffffffffd4 = (int)mchar;
      if (in_stack_ffffffffffffffd4 == 0x28) {
        return false;
      }
      if (in_stack_ffffffffffffffd4 != 0x29) {
        if (in_stack_ffffffffffffffd4 == 0x5b) {
          return false;
        }
        if (in_stack_ffffffffffffffd4 != 0x5d) {
          if (in_stack_ffffffffffffffd4 == 0x7b) {
            return false;
          }
          if (in_stack_ffffffffffffffd4 != 0x7d) goto LAB_007a52a1;
        }
      }
      in_stack_ffffffffffffffc8 = in_RDI;
      getMatchCharacter(mchar);
      bVar1 = segmentcheckReverse((string *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                                  (char)((ulong)in_RDX >> 0x38),
                                  (int *)CONCAT44(in_stack_ffffffffffffffdc,iVar4));
    } while (bVar1);
  }
  return false;
}

Assistant:

static bool
    segmentcheckReverse(const std::string& unit, char closeSegment, int& index)
{
    if (index >= static_cast<int>(unit.size())) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    while (index >= 0) {
        char current = unit[index];
        --index;
        if (index >= 0 && unit[index] == '\\') {
            --index;
            continue;
        }
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '}':
            case ')':
            case ']':
                if (!segmentcheckReverse(
                        unit, getMatchCharacter(current), index)) {
                    // LCOV_EXCL_START
                    return false;
                    // LCOV_EXCL_STOP
                }
                break;
            case '{':
            case '(':
            case '[':
                return false;
            default:
                break;
        }
    }
    // LCOV_EXCL_START
    return false;
    // LCOV_EXCL_STOP
}